

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O1

bool __thiscall
FIX::double_conversion::RoundWeedCounted
          (double_conversion *this,Vector<char> buffer,int length,uint64_t rest,uint64_t ten_kappa,
          uint64_t unit,int *kappa)

{
  undefined4 in_register_0000000c;
  ulong uVar1;
  ulong uVar2;
  double_conversion *pdVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  uVar1 = CONCAT44(in_register_0000000c,length);
  uVar6 = buffer._8_8_;
  if (rest <= uVar1) {
    __assert_fail("rest < ten_kappa",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0xbb,
                  "bool FIX::double_conversion::RoundWeedCounted(Vector<char>, int, uint64_t, uint64_t, uint64_t, int *)"
                 );
  }
  if (ten_kappa < rest - ten_kappa && ten_kappa < rest) {
    if ((uVar1 < rest - uVar1) && (ten_kappa * 2 <= rest + uVar1 * -2)) {
      return true;
    }
    uVar2 = uVar1 - ten_kappa;
    if ((ten_kappa <= uVar1 && uVar2 != 0) && (rest - uVar2 <= uVar2)) {
      iVar4 = buffer.length_;
      if ((0 < iVar4) && (iVar7 = (int)buffer.start_, iVar4 <= iVar7)) {
        this[iVar4 - 1U] = (double_conversion)((char)this[iVar4 - 1U] + '\x01');
        if (1 < iVar4) {
          pdVar3 = this + (iVar4 - 2);
          do {
            uVar5 = (int)uVar6 - 1;
            uVar6 = (ulong)uVar5;
            if (this[uVar6] != (double_conversion)0x3a) break;
            this[uVar6] = (double_conversion)0x30;
            if (iVar7 < (int)(iVar4 - 1U)) goto LAB_00170304;
            *pdVar3 = (double_conversion)((char)*pdVar3 + '\x01');
            pdVar3 = pdVar3 + -1;
          } while (1 < (int)uVar5);
        }
        if (0 < iVar7) {
          if (*this != (double_conversion)0x3a) {
            return true;
          }
          *this = (double_conversion)0x31;
          *(int *)unit = *(int *)unit + 1;
          return true;
        }
      }
LAB_00170304:
      __assert_fail("0 <= index && index < length_",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                    ,0xcc,
                    "T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
    }
  }
  return false;
}

Assistant:

static bool RoundWeedCounted(Vector<char> buffer,
                             int length,
                             uint64_t rest,
                             uint64_t ten_kappa,
                             uint64_t unit,
                             int* kappa) {
  ASSERT(rest < ten_kappa);
  // The following tests are done in a specific order to avoid overflows. They
  // will work correctly with any uint64 values of rest < ten_kappa and unit.
  //
  // If the unit is too big, then we don't know which way to round. For example
  // a unit of 50 means that the real number lies within rest +/- 50. If
  // 10^kappa == 40 then there is no way to tell which way to round.
  if (unit >= ten_kappa) return false;
  // Even if unit is just half the size of 10^kappa we are already completely
  // lost. (And after the previous test we know that the expression will not
  // over/underflow.)
  if (ten_kappa - unit <= unit) return false;
  // If 2 * (rest + unit) <= 10^kappa we can safely round down.
  if ((ten_kappa - rest > rest) && (ten_kappa - 2 * rest >= 2 * unit)) {
    return true;
  }
  // If 2 * (rest - unit) >= 10^kappa, then we can safely round up.
  if ((rest > unit) && (ten_kappa - (rest - unit) <= (rest - unit))) {
    // Increment the last digit recursively until we find a non '9' digit.
    buffer[length - 1]++;
    for (int i = length - 1; i > 0; --i) {
      if (buffer[i] != '0' + 10) break;
      buffer[i] = '0';
      buffer[i - 1]++;
    }
    // If the first digit is now '0'+ 10 we had a buffer with all '9's. With the
    // exception of the first digit all digits are now '0'. Simply switch the
    // first digit to '1' and adjust the kappa. Example: "99" becomes "10" and
    // the power (the kappa) is increased.
    if (buffer[0] == '0' + 10) {
      buffer[0] = '1';
      (*kappa) += 1;
    }
    return true;
  }
  return false;
}